

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_generate_mlsag
              (secp256k1_context *ctx,uint8_t *ki,uint8_t *pc,uint8_t *ps,uint8_t *nonce,
              uint8_t *preimage,size_t nCols,size_t nRows,size_t index,uint8_t **sk,uint8_t *pk)

{
  uint8_t *puVar1;
  undefined4 extraout_EAX;
  int iVar2;
  undefined4 extraout_EAX_00;
  long lVar3;
  secp256k1_fe *rzr;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t len;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  ulong outlen;
  size_t extraout_RDX_03;
  size_t len_00;
  ulong extraout_RDX_04;
  size_t extraout_RDX_05;
  ulong extraout_RDX_06;
  secp256k1_context *psVar4;
  secp256k1_scalar *psVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  secp256k1_sha256 *psVar9;
  undefined8 *puVar10;
  uchar *pub;
  byte bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  secp256k1_ge ge1;
  secp256k1_scalar clast;
  secp256k1_scalar ss;
  uint8_t tmp [64];
  secp256k1_gej gej1;
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_scalar s;
  secp256k1_gej L;
  secp256k1_gej gej2;
  secp256k1_pubkey pubkey;
  secp256k1_sha256 sha256_pre;
  secp256k1_fe zr [8];
  secp256k1_gej R;
  secp256k1_ge pre_a [8];
  secp256k1_gej prej [8];
  secp256k1_strauss_point_state ps_1 [1];
  secp256k1_scalar alpha [33];
  int local_156c;
  secp256k1_context *local_1568;
  size_t local_1560;
  long local_1558;
  uint8_t *local_1550;
  long local_1548;
  ulong local_1540;
  secp256k1_strauss_state local_1538;
  uint8_t *local_1518;
  size_t local_1510;
  uint8_t *local_1508;
  secp256k1_ge local_1500;
  secp256k1_scalar local_14a8;
  secp256k1_scalar local_1488;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  long local_1420;
  undefined1 local_1418 [88];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  int local_13a0;
  secp256k1_rfc6979_hmac_sha256 local_1398;
  secp256k1_scalar local_1348;
  secp256k1_scalar local_1328;
  secp256k1_gej local_1308;
  secp256k1_sha256 local_1288;
  undefined1 local_1218 [104];
  undefined1 local_11b0 [16];
  int local_11a0;
  secp256k1_pubkey local_1190;
  undefined8 local_1150 [13];
  secp256k1_fe local_10e8 [8];
  secp256k1_gej local_fa8;
  secp256k1_ge local_f28 [8];
  secp256k1_gej local_c68 [8];
  secp256k1_strauss_point_state local_868;
  secp256k1_scalar local_458 [33];
  
  bVar11 = 0;
  if (0x21 < nRows) {
    return 1;
  }
  local_1510 = nCols;
  if (nCols == 0) {
    return 1;
  }
  if (nRows < 2) {
    return 1;
  }
  if (pk != (uint8_t *)0x0) {
    lVar6 = nRows - 1;
    local_1348.d[2] = 0;
    local_1348.d[3] = 0;
    local_1348.d[0] = 0;
    local_1348.d[1] = 0;
    local_1468 = *(undefined8 *)nonce;
    uStack_1460 = *(undefined8 *)(nonce + 8);
    local_1458 = *(undefined8 *)(nonce + 0x10);
    uStack_1450 = *(undefined8 *)(nonce + 0x18);
    local_1448 = *(undefined8 *)preimage;
    uStack_1440 = *(undefined8 *)(preimage + 8);
    local_1438 = *(undefined8 *)(preimage + 0x10);
    uStack_1430 = *(undefined8 *)(preimage + 0x18);
    local_1568 = ctx;
    local_1550 = ps;
    local_1518 = pc;
    local_1508 = ki;
    secp256k1_rfc6979_hmac_sha256_initialize(&local_1398,(uchar *)&local_1468,0x40);
    local_1288.s[0] = 0x6a09e667;
    local_1288.s[1] = 0xbb67ae85;
    local_1288.s[2] = 0x3c6ef372;
    local_1288.s[3] = 0xa54ff53a;
    local_1288.s[4] = 0x510e527f;
    local_1288.s[5] = 0x9b05688c;
    local_1288.s[6] = 0x1f83d9ab;
    local_1288.s[7] = 0x5be0cd19;
    local_1288.bytes = 0;
    secp256k1_sha256_write(&local_1288,preimage,0x20);
    psVar9 = &local_1288;
    puVar10 = local_1150;
    for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar10 = *(undefined8 *)psVar9->s;
      psVar9 = (secp256k1_sha256 *)((long)psVar9 + (ulong)bVar11 * -0x10 + 8);
      puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
    }
    sVar7 = extraout_RDX;
    local_1558 = lVar6;
    if (lVar6 != 0) {
      lVar6 = 0;
      psVar4 = local_1568;
      do {
        local_1540 = lVar6 * 0x20;
        psVar5 = local_458 + lVar6;
        local_1548 = lVar6;
        do {
          do {
            secp256k1_rfc6979_hmac_sha256_generate(&local_1398,(uchar *)&local_1468,sVar7);
            secp256k1_scalar_set_b32(psVar5,(uchar *)&local_1468,&local_156c);
            sVar7 = extraout_RDX_00;
          } while (local_156c != 0);
          auVar12._0_4_ = -(uint)((int)psVar5->d[0] == 0 && (int)local_458[lVar6].d[2] == 0);
          auVar12._4_4_ =
               -(uint)(*(int *)((long)local_458[lVar6].d + 4) == 0 &&
                      *(int *)((long)local_458[lVar6].d + 0x14) == 0);
          auVar12._8_4_ =
               -(uint)((int)local_458[lVar6].d[1] == 0 && (int)local_458[lVar6].d[3] == 0);
          auVar12._12_4_ =
               -(uint)(*(int *)((long)local_458[lVar6].d + 0xc) == 0 &&
                      *(int *)((long)local_458[lVar6].d + 0x1c) == 0);
          iVar2 = movmskps(extraout_EAX,auVar12);
        } while (iVar2 == 0xf);
        iVar2 = secp256k1_ec_pubkey_create(psVar4,&local_1190,(uchar *)&local_1468);
        if (iVar2 == 0) {
          return 1;
        }
        local_1560 = 0x21;
        iVar2 = secp256k1_ec_pubkey_serialize
                          (psVar4,(uchar *)&local_1468,&local_1560,&local_1190,0x102);
        lVar6 = local_1548;
        if (iVar2 == 0) {
          return 1;
        }
        if (local_1560 != 0x21) {
          return 1;
        }
        lVar3 = local_1548 * nCols;
        secp256k1_sha256_write(&local_1288,pk + (lVar3 + index) * 0x21,0x21);
        secp256k1_sha256_write(&local_1288,(uchar *)&local_1468,0x21);
        iVar2 = hash_to_curve(&local_1500,pk + (lVar3 + index) * 0x21,len);
        if (iVar2 != 0) {
          return 1;
        }
        local_13a0 = local_1500.infinity;
        local_1418._32_8_ = local_1500.x.n[4];
        local_1418._16_8_ = local_1500.x.n[2];
        local_1418._24_8_ = local_1500.x.n[3];
        local_1418._0_8_ = local_1500.x.n[0];
        local_1418._8_8_ = local_1500.x.n[1];
        local_1418._72_8_ = local_1500.y.n[4];
        local_1418._56_8_ = local_1500.y.n[2];
        local_1418._64_8_ = local_1500.y.n[3];
        local_1418._40_8_ = local_1500.y.n[0];
        local_1418._48_8_ = local_1500.y.n[1];
        local_1418._80_8_ = 1;
        local_13b0 = ZEXT816(0);
        local_13c0 = ZEXT816(0);
        local_1308.x.n[0] = (uint64_t)local_c68;
        local_1308.x.n[1] = (uint64_t)local_10e8;
        local_1308.x.n[2] = (uint64_t)local_f28;
        local_1308.x.n[3] = (uint64_t)&local_868;
        secp256k1_ecmult_strauss_wnaf
                  (&local_1568->ecmult_ctx,(secp256k1_strauss_state *)&local_1308,
                   (secp256k1_gej *)local_1218,1,(secp256k1_gej *)local_1418,psVar5,&local_1348);
        secp256k1_ge_set_gej(&local_1500,(secp256k1_gej *)local_1218);
        secp256k1_eckey_pubkey_serialize(&local_1500,(uchar *)&local_1468,&local_1560,1);
        secp256k1_sha256_write(&local_1288,(uchar *)&local_1468,0x21);
        secp256k1_scalar_set_b32(&local_1328,sk[lVar6],&local_156c);
        psVar4 = local_1568;
        if (local_156c != 0) {
          return 1;
        }
        if ((local_1328.d[3] == 0 && local_1328.d[1] == 0) &&
            (local_1328.d[2] == 0 && local_1328.d[0] == 0)) {
          return 1;
        }
        local_1308.x.n[0] = (uint64_t)local_c68;
        local_1308.x.n[1] = (uint64_t)local_10e8;
        local_1308.x.n[2] = (uint64_t)local_f28;
        local_1308.x.n[3] = (uint64_t)&local_868;
        secp256k1_ecmult_strauss_wnaf
                  (&local_1568->ecmult_ctx,(secp256k1_strauss_state *)&local_1308,
                   (secp256k1_gej *)local_1218,1,(secp256k1_gej *)local_1418,&local_1328,&local_1348
                  );
        secp256k1_ge_set_gej(&local_1500,(secp256k1_gej *)local_1218);
        secp256k1_eckey_pubkey_serialize(&local_1500,local_1508 + local_1540 + lVar6,&local_1560,1);
        lVar6 = lVar6 + 1;
        sVar7 = extraout_RDX_01;
      } while (lVar6 != local_1558);
    }
    lVar6 = local_1558;
    if (nRows != 0) {
      psVar5 = local_458 + local_1558;
      do {
        do {
          secp256k1_rfc6979_hmac_sha256_generate(&local_1398,(uchar *)&local_1468,sVar7);
          secp256k1_scalar_set_b32(psVar5,(uchar *)&local_1468,&local_156c);
          psVar4 = local_1568;
          sVar7 = extraout_RDX_02;
        } while (local_156c != 0);
        auVar13._0_4_ = -(uint)((int)psVar5->d[0] == 0 && (int)local_458[lVar6].d[2] == 0);
        auVar13._4_4_ =
             -(uint)(*(int *)((long)local_458[lVar6].d + 4) == 0 &&
                    *(int *)((long)local_458[lVar6].d + 0x14) == 0);
        auVar13._8_4_ = -(uint)((int)local_458[lVar6].d[1] == 0 && (int)local_458[lVar6].d[3] == 0);
        auVar13._12_4_ =
             -(uint)(*(int *)((long)local_458[lVar6].d + 0xc) == 0 &&
                    *(int *)((long)local_458[lVar6].d + 0x1c) == 0);
        iVar2 = movmskps(extraout_EAX_00,auVar13);
      } while (iVar2 == 0xf);
      iVar2 = secp256k1_ec_pubkey_create(local_1568,&local_1190,(uchar *)&local_1468);
      if (iVar2 == 0) {
        return 1;
      }
      local_1560 = 0x21;
      iVar2 = secp256k1_ec_pubkey_serialize
                        (psVar4,(uchar *)&local_1468,&local_1560,&local_1190,0x102);
      if (iVar2 == 0) {
        return 1;
      }
      if (local_1560 != 0x21) {
        return 1;
      }
      secp256k1_sha256_write(&local_1288,pk + (local_1558 * nCols + index) * 0x21,0x21);
      secp256k1_sha256_write(&local_1288,(uchar *)&local_1468,0x21);
    }
    secp256k1_sha256_finalize(&local_1288,(uchar *)&local_1468);
    secp256k1_scalar_set_b32(&local_14a8,(uchar *)&local_1468,&local_156c);
    if ((local_156c != 0) ||
       ((local_14a8.d[3] == 0 && local_14a8.d[1] == 0) &&
        (local_14a8.d[2] == 0 && local_14a8.d[0] == 0))) {
      return 1;
    }
    outlen = (index + 1) % nCols;
    if (outlen == 0) {
      *(undefined8 *)(local_1518 + 0x10) = local_1458;
      *(undefined8 *)(local_1518 + 0x18) = uStack_1450;
      *(undefined8 *)local_1518 = local_1468;
      *(undefined8 *)(local_1518 + 8) = uStack_1460;
    }
    if (outlen != index) {
      local_1420 = local_1558 * nCols;
      uVar8 = outlen;
      do {
        puVar10 = local_1150;
        psVar9 = &local_1288;
        for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(undefined8 *)psVar9->s = *puVar10;
          puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
          psVar9 = (secp256k1_sha256 *)((long)psVar9 + ((ulong)bVar11 * -2 + 1) * 8);
        }
        if (local_1558 != 0) {
          lVar6 = 0;
          local_1540 = uVar8;
          do {
            uVar8 = local_1540;
            local_1548 = lVar6;
            do {
              do {
                secp256k1_rfc6979_hmac_sha256_generate(&local_1398,(uchar *)&local_1468,outlen);
                secp256k1_scalar_set_b32(&local_1488,(uchar *)&local_1468,&local_156c);
                outlen = extraout_RDX_03;
              } while (local_156c != 0);
            } while ((local_1488.d[3] == 0 && local_1488.d[1] == 0) &&
                     (local_1488.d[2] == 0 && local_1488.d[0] == 0));
            lVar6 = local_1548 * nCols + uVar8;
            lVar3 = lVar6 * 0x20;
            *(undefined8 *)(local_1550 + lVar3 + 0x10) = local_1458;
            *(undefined8 *)(local_1550 + lVar3 + 0x10 + 8) = uStack_1450;
            *(undefined8 *)(local_1550 + lVar3) = local_1468;
            *(undefined8 *)(local_1550 + lVar3 + 8) = uStack_1460;
            pub = pk + lVar6 * 0x21;
            iVar2 = secp256k1_eckey_pubkey_parse(&local_1500,pub,0x21);
            if (iVar2 == 0) {
              return 1;
            }
            local_13a0 = local_1500.infinity;
            local_1418._32_8_ = local_1500.x.n[4];
            local_1418._16_8_ = local_1500.x.n[2];
            local_1418._24_8_ = local_1500.x.n[3];
            local_1418._0_8_ = local_1500.x.n[0];
            local_1418._8_8_ = local_1500.x.n[1];
            local_1418._72_8_ = local_1500.y.n[4];
            local_1418._56_8_ = local_1500.y.n[2];
            local_1418._64_8_ = local_1500.y.n[3];
            local_1418._40_8_ = local_1500.y.n[0];
            local_1418._48_8_ = local_1500.y.n[1];
            local_1418._80_8_ = 1;
            local_13b0 = ZEXT816(0);
            local_13c0 = ZEXT816(0);
            local_1538.prej = local_c68;
            local_1538.zr = local_10e8;
            local_1538.pre_a = local_f28;
            local_1538.ps = &local_868;
            secp256k1_ecmult_strauss_wnaf
                      (&local_1568->ecmult_ctx,&local_1538,&local_1308,1,(secp256k1_gej *)local_1418
                       ,&local_14a8,&local_1488);
            iVar2 = hash_to_curve(&local_1500,pub,len_00);
            lVar6 = local_1548;
            if (iVar2 != 0) {
              return 1;
            }
            local_13a0 = local_1500.infinity;
            local_1418._32_8_ = local_1500.x.n[4];
            local_1418._16_8_ = local_1500.x.n[2];
            local_1418._24_8_ = local_1500.x.n[3];
            local_1418._0_8_ = local_1500.x.n[0];
            local_1418._8_8_ = local_1500.x.n[1];
            local_1418._72_8_ = local_1500.y.n[4];
            local_1418._56_8_ = local_1500.y.n[2];
            local_1418._64_8_ = local_1500.y.n[3];
            local_1418._40_8_ = local_1500.y.n[0];
            local_1418._48_8_ = local_1500.y.n[1];
            local_1418._80_8_ = 1;
            local_13b0 = ZEXT816(0);
            local_13c0 = ZEXT816(0);
            local_1538.prej = local_c68;
            local_1538.zr = local_10e8;
            local_1538.pre_a = local_f28;
            local_1538.ps = &local_868;
            secp256k1_ecmult_strauss_wnaf
                      (&local_1568->ecmult_ctx,&local_1538,(secp256k1_gej *)local_1418,1,
                       (secp256k1_gej *)local_1418,&local_1488,&local_1348);
            iVar2 = secp256k1_eckey_pubkey_parse(&local_1500,local_1508 + lVar6 * 0x21,0x21);
            if (iVar2 == 0) {
              return 1;
            }
            local_11a0 = local_1500.infinity;
            local_1218._32_8_ = local_1500.x.n[4];
            local_1218._16_8_ = local_1500.x.n[2];
            local_1218._24_8_ = local_1500.x.n[3];
            local_1218._0_8_ = local_1500.x.n[0];
            local_1218._8_8_ = local_1500.x.n[1];
            local_1218._72_8_ = local_1500.y.n[4];
            local_1218._56_8_ = local_1500.y.n[2];
            local_1218._64_8_ = local_1500.y.n[3];
            local_1218._40_8_ = local_1500.y.n[0];
            local_1218._48_8_ = local_1500.y.n[1];
            local_1218._80_8_ = 1;
            local_11b0 = (undefined1  [16])0x0;
            local_1218._88_16_ = (undefined1  [16])0x0;
            local_1538.prej = local_c68;
            local_1538.zr = local_10e8;
            local_1538.pre_a = local_f28;
            local_1538.ps = &local_868;
            rzr = (secp256k1_fe *)0x1;
            secp256k1_ecmult_strauss_wnaf
                      (&local_1568->ecmult_ctx,&local_1538,(secp256k1_gej *)local_1218,1,
                       (secp256k1_gej *)local_1218,&local_14a8,&local_1348);
            secp256k1_gej_add_var
                      (&local_fa8,(secp256k1_gej *)local_1418,(secp256k1_gej *)local_1218,rzr);
            secp256k1_sha256_write(&local_1288,pub,0x21);
            secp256k1_ge_set_gej(&local_1500,&local_1308);
            secp256k1_eckey_pubkey_serialize(&local_1500,(uchar *)&local_1468,&local_1560,1);
            secp256k1_sha256_write(&local_1288,(uchar *)&local_1468,0x21);
            secp256k1_ge_set_gej(&local_1500,&local_fa8);
            secp256k1_eckey_pubkey_serialize(&local_1500,(uchar *)&local_1468,&local_1560,1);
            secp256k1_sha256_write(&local_1288,(uchar *)&local_1468,0x21);
            lVar6 = lVar6 + 1;
            outlen = extraout_RDX_04;
            uVar8 = local_1540;
          } while (lVar6 != local_1558);
        }
        if (nRows != 0) {
          do {
            do {
              secp256k1_rfc6979_hmac_sha256_generate(&local_1398,(uchar *)&local_1468,outlen);
              secp256k1_scalar_set_b32(&local_1488,(uchar *)&local_1468,&local_156c);
              outlen = extraout_RDX_05;
            } while (local_156c != 0);
          } while ((local_1488.d[3] == 0 && local_1488.d[1] == 0) &&
                   (local_1488.d[2] == 0 && local_1488.d[0] == 0));
          lVar6 = local_1420 + uVar8;
          lVar3 = lVar6 * 0x20;
          *(undefined8 *)(local_1550 + lVar3 + 0x10) = local_1458;
          *(undefined8 *)(local_1550 + lVar3 + 0x10 + 8) = uStack_1450;
          *(undefined8 *)(local_1550 + lVar3) = local_1468;
          *(undefined8 *)(local_1550 + lVar3 + 8) = uStack_1460;
          iVar2 = secp256k1_eckey_pubkey_parse(&local_1500,pk + lVar6 * 0x21,0x21);
          if (iVar2 == 0) {
            return 1;
          }
          local_13a0 = local_1500.infinity;
          local_1418._32_8_ = local_1500.x.n[4];
          local_1418._16_8_ = local_1500.x.n[2];
          local_1418._24_8_ = local_1500.x.n[3];
          local_1418._0_8_ = local_1500.x.n[0];
          local_1418._8_8_ = local_1500.x.n[1];
          local_1418._40_8_ = local_1500.y.n[0];
          local_1418._48_8_ = local_1500.y.n[1];
          local_1418._72_8_ = local_1500.y.n[4];
          local_1418._56_8_ = local_1500.y.n[2];
          local_1418._64_8_ = local_1500.y.n[3];
          local_1418._80_8_ = 1;
          local_13b0 = (undefined1  [16])0x0;
          local_13c0 = (undefined1  [16])0x0;
          secp256k1_ecmult(&local_1568->ecmult_ctx,&local_1308,(secp256k1_gej *)local_1418,
                           &local_14a8,&local_1488);
          secp256k1_sha256_write(&local_1288,pk + lVar6 * 0x21,0x21);
          secp256k1_ge_set_gej(&local_1500,&local_1308);
          secp256k1_eckey_pubkey_serialize(&local_1500,(uchar *)&local_1468,&local_1560,1);
          secp256k1_sha256_write(&local_1288,(uchar *)&local_1468,0x21);
        }
        secp256k1_sha256_finalize(&local_1288,(uchar *)&local_1468);
        secp256k1_scalar_set_b32(&local_14a8,(uchar *)&local_1468,&local_156c);
        if (local_156c != 0) {
          return 1;
        }
        if ((local_14a8.d[3] == 0 && local_14a8.d[1] == 0) &&
            (local_14a8.d[2] == 0 && local_14a8.d[0] == 0)) {
          return 1;
        }
        uVar8 = uVar8 + 1;
        if (uVar8 == nCols) {
          uVar8 = 0;
        }
        if (uVar8 == 0) {
          *(undefined8 *)(local_1518 + 0x10) = local_1458;
          *(undefined8 *)(local_1518 + 0x18) = uStack_1450;
          *(undefined8 *)local_1518 = local_1468;
          *(undefined8 *)(local_1518 + 8) = uStack_1460;
        }
        outlen = extraout_RDX_06;
      } while (uVar8 != index);
    }
    if (nRows != 0) {
      local_1550 = local_1550 + index * 0x20;
      local_1510 = local_1510 << 5;
      psVar5 = local_458;
      sVar7 = 0;
      do {
        secp256k1_scalar_set_b32(&local_1488,sk[sVar7],&local_156c);
        if (local_156c != 0) {
          return 1;
        }
        if ((local_1488.d[3] == 0 && local_1488.d[1] == 0) &&
            (local_1488.d[2] == 0 && local_1488.d[0] == 0)) {
          return 1;
        }
        secp256k1_scalar_mul(&local_1328,&local_14a8,&local_1488);
        secp256k1_scalar_negate(&local_1328,&local_1328);
        secp256k1_scalar_add(&local_1488,psVar5,&local_1328);
        puVar1 = local_1550;
        secp256k1_scalar_get_b32(local_1550,&local_1488);
        sVar7 = sVar7 + 1;
        local_1550 = puVar1 + local_1510;
        psVar5 = psVar5 + 1;
      } while (nRows != sVar7);
    }
    return 0;
  }
  return 1;
}

Assistant:

int secp256k1_generate_mlsag(const secp256k1_context *ctx,
    uint8_t *ki, uint8_t *pc, uint8_t *ps,
    const uint8_t *nonce, const uint8_t *preimage, size_t nCols,
    size_t nRows, size_t index, const uint8_t **sk, const uint8_t *pk)
{
    /* nRows == nInputs + 1, last row sums commitments
    */

    secp256k1_rfc6979_hmac_sha256 rng;
    secp256k1_sha256 sha256_m, sha256_pre;
    size_t dsRows = nRows-1; /* TODO: pass in dsRows explicitly? */
    /* secp256k1_scalar alpha[nRows]; */
    secp256k1_scalar alpha[MLSAG_MAX_ROWS]; /* To remove MLSAG_MAX_ROWS limit, malloc 32 * nRows for alpha  */
    secp256k1_scalar zero, clast, s, ss;
    secp256k1_pubkey pubkey;
    secp256k1_ge ge1;
    secp256k1_gej gej1, gej2, L, R;
    uint8_t tmp[32 + 32];
    size_t i, k, clen;
    int overflow;

    if (!pk
        || nRows < 2
        || nCols < 1
        || nRows > MLSAG_MAX_ROWS) {
        return 1;
    }

    secp256k1_scalar_set_int(&zero, 0);

    memcpy(tmp, nonce, 32);
    memcpy(tmp+32, preimage, 32);

    /* seed the random no. generator */
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, tmp, 32 + 32);

    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_sha256_write(&sha256_m, preimage, 32);
    sha256_pre = sha256_m;

    for (k = 0; k < dsRows; ++k) {
        do {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            secp256k1_scalar_set_b32(&alpha[k], tmp, &overflow);
        } while (overflow || secp256k1_scalar_is_zero(&alpha[k]));

        if (!secp256k1_ec_pubkey_create(ctx, &pubkey, tmp)) { /* G * alpha[col] */
            return 1;
        }
        clen = 33; /* must be set */
        if (!secp256k1_ec_pubkey_serialize(ctx, tmp, &clen, &pubkey, SECP256K1_EC_COMPRESSED)
            || clen != 33) {
            return 1;
        }

        secp256k1_sha256_write(&sha256_m, &pk[(index + k*nCols)*33], 33); /* pk_ind[col] */
        secp256k1_sha256_write(&sha256_m, tmp, 33); /* G * alpha[col] */

        if (0 != hash_to_curve(&ge1, &pk[(index + k*nCols)*33], 33)) { /* H(pk_ind[col]) */
            return 1;
        }

        secp256k1_gej_set_ge(&gej1, &ge1);
        secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej1, &alpha[k], &zero);  /* gej2 = H(pk_ind[col]) * alpha[col] */

        secp256k1_ge_set_gej(&ge1, &gej2);
        secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
        secp256k1_sha256_write(&sha256_m, tmp, 33); /* H(pk_ind[col]) * alpha[col] */

        secp256k1_scalar_set_b32(&s, sk[k], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&s)) {
            return 1;
        }
        secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej1, &s, &zero);  /* gej2 = H(pk_ind[col]) * sk_ind[col] */
        secp256k1_ge_set_gej(&ge1, &gej2);
        secp256k1_eckey_pubkey_serialize(&ge1, &ki[k * 33], &clen, 1);
    }

    for (k = dsRows; k < nRows; ++k) {
        do {
            secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
            secp256k1_scalar_set_b32(&alpha[k], tmp, &overflow);
        } while (overflow || secp256k1_scalar_is_zero(&alpha[k]));

        if (!secp256k1_ec_pubkey_create(ctx, &pubkey, tmp)) { /* G * alpha[col] */
            return 1;
        }
        clen = 33; /* must be set */
        if (!secp256k1_ec_pubkey_serialize(ctx, tmp, &clen, &pubkey, SECP256K1_EC_COMPRESSED)
            || clen != 33) {
            return 1;
        }
        secp256k1_sha256_write(&sha256_m, &pk[(index + k*nCols)*33], 33); /* pk_ind[col] */
        secp256k1_sha256_write(&sha256_m, tmp, 33); /* G * alpha[col] */
    }

    secp256k1_sha256_finalize(&sha256_m, tmp);
    secp256k1_scalar_set_b32(&clast, tmp, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&clast)) {
        return 1;
    }

    i = (index + 1) % nCols;

    if (i == 0) {
        memcpy(pc, tmp, 32); /* *pc = clast */
    }

    while (i != index) {
        sha256_m = sha256_pre; /* set to after preimage hashed */

        for (k = 0; k < dsRows; ++k) {
            do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
                secp256k1_scalar_set_b32(&ss, tmp, &overflow);
            } while (overflow || secp256k1_scalar_is_zero(&ss));

            memcpy(&ps[(i + k*nCols)*32], tmp, 32);

            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss); /* L = G * ss + pk[k][i] * clast */


            /* R = H(pk[k][i]) * ss + ki[k] * clast */
            if (0 != hash_to_curve(&ge1, &pk[(i + k*nCols)*33], 33)) { /* H(pk[k][i]) */
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej1, &gej1, &ss, &zero); /* gej1 = H(pk[k][i]) * ss */

            if (!secp256k1_eckey_pubkey_parse(&ge1, &ki[k * 33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej2, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej2, &clast, &zero); /* gej2 = ki[k] * clast */

            secp256k1_gej_add_var(&R, &gej1, &gej2, NULL);  /* R =  gej1 + gej2 */

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
            secp256k1_ge_set_gej(&ge1, &R);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* R */
        }

        for (k = dsRows; k < nRows; ++k) {
            do {
                secp256k1_rfc6979_hmac_sha256_generate(&rng, tmp, 32);
                secp256k1_scalar_set_b32(&ss, tmp, &overflow);
            } while (overflow || secp256k1_scalar_is_zero(&ss));

            memcpy(&ps[(i + k*nCols)*32], tmp, 32);

            /* L = G * ss + pk[k][i] * clast */
            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss);

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
        }

        secp256k1_sha256_finalize(&sha256_m, tmp);
        secp256k1_scalar_set_b32(&clast, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&clast)) {
            return 1;
        }
        i = (i + 1) % nCols;

        if (i == 0) {
            memcpy(pc, tmp, 32); /* *pc = clast */
        }
    }


    for (k = 0; k < nRows; ++k) {
        /* ss[k][index] = alpha[k] - clast * sk[k] */

        secp256k1_scalar_set_b32(&ss, sk[k], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ss)) {
            return 1;
        }
        secp256k1_scalar_mul(&s, &clast, &ss);

        secp256k1_scalar_negate(&s, &s);
        secp256k1_scalar_add(&ss, &alpha[k], &s);

        secp256k1_scalar_get_b32(&ps[(index + k*nCols)*32], &ss);
    }

    secp256k1_rfc6979_hmac_sha256_finalize(&rng);

    return 0;
}